

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_prn.cc
# Opt level: O0

int X509V3_extensions_print
              (BIO *out,char *title,stack_st_X509_EXTENSION *exts,ulong flag,int indent)

{
  int iVar1;
  size_t sVar2;
  X509_EXTENSION *ex_00;
  ASN1_OBJECT *a;
  ASN1_OCTET_STRING *v;
  char *pcVar3;
  ASN1_OBJECT *obj;
  X509_EXTENSION *ex;
  ulong uStack_40;
  int j;
  size_t i;
  int indent_local;
  unsigned_long flag_local;
  stack_st_X509_EXTENSION *exts_local;
  char *title_local;
  BIO *bp_local;
  
  sVar2 = sk_X509_EXTENSION_num((stack_st_X509_EXTENSION *)exts);
  if (sVar2 != 0) {
    i._4_4_ = indent;
    if (title != (char *)0x0) {
      BIO_printf(out,"%*s%s:\n",(ulong)(uint)indent,"",title);
      i._4_4_ = indent + 4;
    }
    for (uStack_40 = 0; sVar2 = sk_X509_EXTENSION_num((stack_st_X509_EXTENSION *)exts),
        uStack_40 < sVar2; uStack_40 = uStack_40 + 1) {
      ex_00 = (X509_EXTENSION *)sk_X509_EXTENSION_value((stack_st_X509_EXTENSION *)exts,uStack_40);
      if ((i._4_4_ != 0) && (iVar1 = BIO_printf(out,"%*s",(ulong)i._4_4_,""), iVar1 < 1)) {
        return 0;
      }
      a = X509_EXTENSION_get_object(ex_00);
      i2a_ASN1_OBJECT(out,a);
      iVar1 = X509_EXTENSION_get_critical(ex_00);
      pcVar3 = "";
      if (iVar1 != 0) {
        pcVar3 = "critical";
      }
      iVar1 = BIO_printf(out,": %s\n",pcVar3);
      if (iVar1 < 1) {
        return 0;
      }
      iVar1 = X509V3_EXT_print(out,ex_00,flag,i._4_4_ + 4);
      if (iVar1 == 0) {
        BIO_printf(out,"%*s",(ulong)(i._4_4_ + 4),"");
        v = X509_EXTENSION_get_data(ex_00);
        ASN1_STRING_print(out,v);
      }
      iVar1 = BIO_write(out,"\n",1);
      if (iVar1 < 1) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int X509V3_extensions_print(BIO *bp, const char *title,
                            const STACK_OF(X509_EXTENSION) *exts,
                            unsigned long flag, int indent) {
  size_t i;
  int j;

  if (sk_X509_EXTENSION_num(exts) <= 0) {
    return 1;
  }

  if (title) {
    BIO_printf(bp, "%*s%s:\n", indent, "", title);
    indent += 4;
  }

  for (i = 0; i < sk_X509_EXTENSION_num(exts); i++) {
    const X509_EXTENSION *ex = sk_X509_EXTENSION_value(exts, i);
    if (indent && BIO_printf(bp, "%*s", indent, "") <= 0) {
      return 0;
    }
    const ASN1_OBJECT *obj = X509_EXTENSION_get_object(ex);
    i2a_ASN1_OBJECT(bp, obj);
    j = X509_EXTENSION_get_critical(ex);
    if (BIO_printf(bp, ": %s\n", j ? "critical" : "") <= 0) {
      return 0;
    }
    if (!X509V3_EXT_print(bp, ex, flag, indent + 4)) {
      BIO_printf(bp, "%*s", indent + 4, "");
      ASN1_STRING_print(bp, X509_EXTENSION_get_data(ex));
    }
    if (BIO_write(bp, "\n", 1) <= 0) {
      return 0;
    }
  }
  return 1;
}